

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffercache.h
# Opt level: O2

size_t __thiscall
pbrt::BufferCache<pbrt::Vector3<float>_>::BufferHasher::operator()(BufferHasher *this,Buffer *b)

{
  uint64_t uVar1;
  
  uVar1 = MurmurHash64A(b->ptr,(int)b->size,0);
  return uVar1;
}

Assistant:

size_t operator()(const Buffer &b) const { return HashBuffer(b.ptr, b.size); }